

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synth_core.cpp
# Opt level: O2

void __thiscall V2Osc::renderFMSin(V2Osc *this,float *dest,int nsamples)

{
  float fVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  float fVar5;
  
  uVar4 = 0;
  uVar3 = (ulong)(uint)nsamples;
  if (nsamples < 1) {
    uVar3 = uVar4;
  }
  for (; uVar3 != uVar4; uVar4 = uVar4 + 1) {
    fVar5 = dest[uVar4];
    uVar2 = this->cnt;
    this->cnt = uVar2 + this->freq;
    fVar1 = this->gain;
    fVar5 = fastsinrc(((float)(uVar2 >> 9 | 0x3f800000) + -1.0 + fVar5 + fVar5) * 6.2831855);
    fVar5 = fVar5 * fVar1;
    if (this->ring == true) {
      fVar5 = fVar5 * dest[uVar4];
    }
    dest[uVar4] = fVar5;
  }
  return;
}

Assistant:

void renderFMSin(float *dest, int nsamples)
    {
        COVER("Osc FM");

        // V2's take on FM is a bit unconventional but fairly slick and flexible.
        // The carrier wave is always a sine, but the modulator is whatever happens
        // to be in the voice buffer at that point - which is the output of the
        // previous oscillators. So you can use all the oscillator waveforms
        // (including noise, other FMs and the aux bus oscillators!) as modulator
        // if you are so inclined.
        //
        // And it's very little code too :)
        for (int i=0; i < nsamples; i++)
        {
            float mod = dest[i] * fcfmmax;
            float t = (utof23(cnt) + mod) * fc2pi;
            cnt += freq;

            float out = gain * fastsinrc(t);
            if (ring)
                dest[i] *= out;
            else
                dest[i] = out;
        }
    }